

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbytarr.cpp
# Opt level: O2

int __thiscall CVmObjByteArray::write_to_data_file(CVmObjByteArray *this,CVmDataSource *fp)

{
  uint32_t tmp;
  int iVar1;
  char buf [16];
  
  buf._0_4_ = *(undefined4 *)(this->super_CVmObject).ext_;
  iVar1 = (*fp->_vptr_CVmDataSource[4])(fp,buf,4);
  if (iVar1 == 0) {
    iVar1 = write_to_file(this,fp,1,(ulong)*(uint *)(this->super_CVmObject).ext_);
  }
  else {
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int CVmObjByteArray::write_to_data_file(CVmDataSource *fp)
{
    char buf[16];

    /* write the number of bytes in our array */
    oswp4(buf, get_element_count());
    if (fp->write(buf, 4))
        return 1;

    /* write the bytes */
    return write_to_file(fp, 1, get_element_count());
}